

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

Float __thiscall
pbrt::ExhaustiveLightSampler::PMF(ExhaustiveLightSampler *this,LightSampleContext *ctx,Light *light)

{
  bool bVar1;
  size_t sVar2;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *tp;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *in_RDX;
  long in_RSI;
  long in_RDI;
  Float FVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [56];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  Point3f PVar9;
  Float pdf;
  Float pInfinite;
  Float importance;
  size_t i;
  Float lightImportance;
  Float importanceSum;
  LightBounds *in_stack_00000180;
  undefined1 in_stack_00000198 [12];
  undefined1 in_stack_000001b8 [12];
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff40;
  LightSampleContext *in_stack_ffffffffffffff80;
  ulong local_30;
  float local_28;
  float local_24;
  float local_4;
  
  auVar5 = in_ZMM0._0_16_;
  bVar1 = HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
          ::HasKey(in_stack_ffffffffffffff40,
                   (Light *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (bVar1) {
    local_24 = 0.0;
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    local_28 = 0.0;
    local_30 = 0;
    while( true ) {
      auVar8 = in_ZMM1._0_16_;
      sVar2 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                        ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                         (in_RDI + 0x20));
      auVar7 = auVar6._8_56_;
      auVar5 = auVar6._0_16_;
      if (sVar2 <= local_30) break;
      pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
      operator[]((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *)
                 (in_RDI + 0x60),local_30);
      PVar9 = LightSampleContext::p(in_stack_ffffffffffffff80);
      auVar6._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar6._8_56_ = auVar7;
      vmovlpd_avx(auVar6._0_16_);
      in_stack_ffffffffffffff80 = *(LightSampleContext **)(in_RSI + 0x18);
      in_ZMM1 = ZEXT464((uint)PVar9.super_Tuple3<pbrt::Point3,_float>.z);
      FVar3 = LightBounds::Importance
                        (in_stack_00000180,(Point3f)in_stack_000001b8,(Normal3f)in_stack_00000198);
      local_24 = FVar3 + local_24;
      auVar6 = ZEXT464((uint)local_24);
      tp = &pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::operator[]
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RDI + 0x20),local_30)->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      ;
      bVar1 = TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              ::operator==(in_RDX,tp);
      if (bVar1) {
        auVar6 = ZEXT464((uint)FVar3);
        local_28 = FVar3;
      }
      local_30 = local_30 + 1;
    }
    sVar2 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RDI + 0x40));
    auVar5 = vcvtusi2ss_avx512f(auVar5,sVar2);
    fVar4 = auVar5._0_4_;
    sVar2 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RDI + 0x40));
    bVar1 = pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
            empty((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *
                  )0x8f93ec);
    auVar5 = vcvtusi2ss_avx512f(auVar8,sVar2 + (long)(int)(uint)(((bVar1 ^ 0xffU) & 1) != 0));
    local_4 = (local_28 / local_24) * (1.0 - fVar4 / auVar5._0_4_);
  }
  else {
    sVar2 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RDI + 0x40));
    bVar1 = pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
            empty((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *
                  )0x8f91ef);
    auVar5 = vcvtusi2ss_avx512f(auVar5,sVar2 + (long)(int)(uint)(((bVar1 ^ 0xffU) & 1) != 0));
    local_4 = 1.0 / auVar5._0_4_;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU Float ExhaustiveLightSampler::PMF(const LightSampleContext &ctx, Light light) const {
    if (!lightToBoundedIndex.HasKey(light))
        return 1.f / (infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));

    Float importanceSum = 0;
    Float lightImportance = 0;
    for (size_t i = 0; i < boundedLights.size(); ++i) {
        Float importance = lightBounds[i].Importance(ctx.p(), ctx.n);
        importanceSum += importance;
        if (light == boundedLights[i])
            lightImportance = importance;
    }
    Float pInfinite = Float(infiniteLights.size()) /
                      Float(infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));
    Float pdf = lightImportance / importanceSum * (1. - pInfinite);
    return pdf;
}